

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

char * ucnv_io_stripASCIIForCompare_63(char *dst,char *name)

{
  bool bVar1;
  byte *pbVar2;
  uint8_t local_2d;
  byte local_25;
  byte local_23;
  UBool afterDigit;
  char c1;
  uint8_t nextType;
  byte *pbStack_20;
  uint8_t type;
  char *dstItr;
  char *name_local;
  char *dst_local;
  
  bVar1 = false;
  pbStack_20 = (byte *)dst;
  dstItr = name;
  while( true ) {
    while( true ) {
      pbVar2 = (byte *)(dstItr + 1);
      local_23 = *dstItr;
      if (local_23 == 0) {
        *pbStack_20 = 0;
        return dst;
      }
      if ((char)local_23 < '\0') {
        local_25 = 0;
      }
      else {
        local_25 = ""[local_23];
      }
      dstItr = (char *)pbVar2;
      if (local_25 != 0) break;
      bVar1 = false;
    }
    if (local_25 != 1) break;
    if (bVar1) goto LAB_003773dc;
    if ((char)*pbVar2 < '\0') {
      local_2d = '\0';
    }
    else {
      local_2d = ""[*pbVar2];
    }
    if ((local_2d != '\x01') && (local_2d != '\x02')) {
LAB_003773dc:
      *pbStack_20 = local_23;
      pbStack_20 = pbStack_20 + 1;
    }
  }
  if (local_25 == 2) {
    bVar1 = true;
  }
  else {
    local_23 = local_25;
    bVar1 = false;
  }
  goto LAB_003773dc;
}

Assistant:

U_CAPI char * U_CALLCONV
ucnv_io_stripASCIIForCompare(char *dst, const char *name) {
    char *dstItr = dst;
    uint8_t type, nextType;
    char c1;
    UBool afterDigit = FALSE;

    while ((c1 = *name++) != 0) {
        type = GET_ASCII_TYPE(c1);
        switch (type) {
        case UIGNORE:
            afterDigit = FALSE;
            continue; /* ignore all but letters and digits */
        case ZERO:
            if (!afterDigit) {
                nextType = GET_ASCII_TYPE(*name);
                if (nextType == ZERO || nextType == NONZERO) {
                    continue; /* ignore leading zero before another digit */
                }
            }
            break;
        case NONZERO:
            afterDigit = TRUE;
            break;
        default:
            c1 = (char)type; /* lowercased letter */
            afterDigit = FALSE;
            break;
        }
        *dstItr++ = c1;
    }
    *dstItr = 0;
    return dst;
}